

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O0

void __thiscall
TTD::RuntimeContextInfo::MarkWellKnownObjects_TTD(RuntimeContextInfo *this,MarkTable *marks)

{
  int iVar1;
  RecyclableObject **ppRVar2;
  FunctionBody **ppFVar3;
  FunctionBody *body;
  int32 i_1;
  RecyclableObject *obj;
  int32 i;
  MarkTable *marks_local;
  RuntimeContextInfo *this_local;
  
  obj._4_4_ = 0;
  while( true ) {
    iVar1 = JsUtil::ReadOnlyList<Js::RecyclableObject_*,_Memory::HeapAllocator,_DefaultComparer>::
            Count(&(this->m_sortedObjectList).
                   super_ReadOnlyList<Js::RecyclableObject_*,_Memory::HeapAllocator,_DefaultComparer>
                 );
    if (iVar1 <= obj._4_4_) break;
    ppRVar2 = JsUtil::
              List<Js::RecyclableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(&this->m_sortedObjectList,obj._4_4_);
    MarkTable::MarkAddrWithSpecialInfo<(TTD::MarkTableTag)16>(marks,*ppRVar2);
    obj._4_4_ = obj._4_4_ + 1;
  }
  body._4_4_ = 0;
  while( true ) {
    iVar1 = JsUtil::ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>::Count
                      (&(this->m_sortedFunctionBodyList).
                        super_ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>
                      );
    if (iVar1 <= body._4_4_) break;
    ppFVar3 = JsUtil::
              List<Js::FunctionBody_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(&this->m_sortedFunctionBodyList,body._4_4_);
    MarkTable::MarkAddrWithSpecialInfo<(TTD::MarkTableTag)16>(marks,*ppFVar3);
    body._4_4_ = body._4_4_ + 1;
  }
  return;
}

Assistant:

void RuntimeContextInfo::MarkWellKnownObjects_TTD(MarkTable& marks) const
    {
        for(int32 i = 0; i < this->m_sortedObjectList.Count(); ++i)
        {
            Js::RecyclableObject* obj = this->m_sortedObjectList.Item(i);
            marks.MarkAddrWithSpecialInfo<MarkTableTag::JsWellKnownObj>(obj);
        }

        for(int32 i = 0; i < this->m_sortedFunctionBodyList.Count(); ++i)
        {
            Js::FunctionBody* body = this->m_sortedFunctionBodyList.Item(i);
            marks.MarkAddrWithSpecialInfo<MarkTableTag::JsWellKnownObj>(body);
        }
    }